

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid.cpp
# Opt level: O0

void __thiscall pstore::uuid::uuid(uuid *this)

{
  int iVar1;
  variant_type vVar2;
  version_type vVar3;
  iterator pvVar4;
  iterator pvVar5;
  byte *pbVar6;
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> _;
  uuid *this_local;
  
  memset(this,0,0x10);
  if (uuid()::random == '\0') {
    iVar1 = __cxa_guard_acquire(&uuid()::random);
    if (iVar1 != 0) {
      random_generator<unsigned_short>::random_generator(&uuid::random);
      __cxa_atexit(random_generator<unsigned_short>::~random_generator,&uuid::random,&__dso_handle);
      __cxa_guard_release(&uuid()::random);
    }
  }
  std::lock_guard<std::mutex>::lock_guard(&local_28,&uuid::mutex);
  pvVar4 = std::begin<std::array<unsigned_char,16ul>>(&this->data_);
  pvVar5 = std::end<std::array<unsigned_char,16ul>>(&this->data_);
  std::generate<unsigned_char*,pstore::uuid::uuid()::__0>(pvVar4,pvVar5);
  std::lock_guard<std::mutex>::~lock_guard(&local_28);
  pbVar6 = std::array<unsigned_char,_16UL>::operator[](&this->data_,8);
  *pbVar6 = *pbVar6 & 0xbf;
  pbVar6 = std::array<unsigned_char,_16UL>::operator[](&this->data_,8);
  *pbVar6 = *pbVar6 | 0x80;
  pbVar6 = std::array<unsigned_char,_16UL>::operator[](&this->data_,6);
  *pbVar6 = *pbVar6 & 0x4f;
  pbVar6 = std::array<unsigned_char,_16UL>::operator[](&this->data_,6);
  *pbVar6 = *pbVar6 | 0x40;
  vVar2 = variant(this);
  if (vVar2 == rfc_4122) {
    vVar3 = version(this);
    if (vVar3 == random_number_based) {
      return;
    }
    assert_failed("this->version () == uuid::version_type::random_number_based",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/uuid.cpp"
                  ,0x5c);
  }
  assert_failed("this->variant () == uuid::variant_type::rfc_4122",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/uuid.cpp"
                ,0x5b);
}

Assistant:

uuid::uuid () {
        {
            static std::mutex mutex;
            static random_generator<unsigned short> random;
            std::lock_guard<std::mutex> _{mutex};
            std::generate (std::begin (data_), std::end (data_), [] () {
                return static_cast<std::uint8_t> (random.get () %
                                                  std::numeric_limits<std::uint8_t>::max ());
            });
        }

        // Set variant: must be 0b10xxxxxx
        data_[variant_octet] &= 0b10111111;
        data_[variant_octet] |= 0b10000000;

        // Set version: must be 0b0100xxxx
        data_[version_octet] &= 0x4F; // 0b01001111;
        data_[version_octet] |= static_cast<std::uint8_t> (version_type::random_number_based) << 4;

        PSTORE_ASSERT (this->variant () == uuid::variant_type::rfc_4122);
        PSTORE_ASSERT (this->version () == uuid::version_type::random_number_based);
    }